

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  BuildPrim *pBVar1;
  BuildPrim *pBVar2;
  TriangleMesh *pTVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  runtime_error *prVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  size_t i;
  ulong uVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 extraout_XMM1_Qa;
  float fVar16;
  float fVar17;
  undefined8 extraout_XMM1_Qb;
  float fVar18;
  uint uVar19;
  uint uVar21;
  uint uVar22;
  undefined1 auVar20 [16];
  float fVar23;
  float fVar24;
  undefined1 in_XMM4 [16];
  vfloat4 lower;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  task_group_context context;
  auto_partitioner local_169;
  range<unsigned_int> local_168;
  undefined8 uStack_160;
  anon_class_8_1_8991fb9c local_150;
  undefined8 local_148;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  anon_class_16_2_ed117de8_conflict24 local_128;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  local_118;
  task_group_context local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar19 = current->_begin;
  uVar13 = (ulong)uVar19;
  uVar21 = current->_end;
  uVar9 = (ulong)uVar21;
  if (uVar21 - uVar19 < 0x400) {
    auVar14 = _DAT_01f7a9f0;
    auVar20 = _DAT_01f7aa00;
    if (uVar19 < uVar21) {
      pTVar3 = this->calculateBounds->mesh;
      lVar4 = *(long *)&(pTVar3->super_Geometry).field_0x58;
      pcVar5 = (pTVar3->vertices0).super_RawBufferView.ptr_ofs;
      sVar6 = (pTVar3->vertices0).super_RawBufferView.stride;
      uVar10 = uVar13;
      do {
        lVar12 = (ulong)this->morton[uVar10].field_0.field_0.index * *(long *)&pTVar3->field_0x68;
        in_XMM4 = *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 8 + lVar12) * sVar6);
        auVar25 = minps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar12) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar12) * sVar6));
        auVar26 = minps(auVar25,in_XMM4);
        auVar25 = maxps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar12) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar12) * sVar6));
        auVar25 = maxps(auVar25,in_XMM4);
        auVar27._0_4_ = auVar25._0_4_ + auVar26._0_4_;
        auVar27._4_4_ = auVar25._4_4_ + auVar26._4_4_;
        auVar27._8_4_ = auVar25._8_4_ + auVar26._8_4_;
        auVar27._12_4_ = auVar25._12_4_ + auVar26._12_4_;
        auVar14 = minps(auVar14,auVar27);
        auVar20 = maxps(auVar20,auVar27);
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    if (uVar19 < uVar21) {
      auVar25._0_4_ = auVar20._0_4_ - auVar14._0_4_;
      auVar25._4_4_ = auVar20._4_4_ - auVar14._4_4_;
      auVar25._8_4_ = auVar20._8_4_ - auVar14._8_4_;
      auVar25._12_4_ = auVar20._12_4_ - auVar14._12_4_;
      auVar20 = rcpps(in_XMM4,auVar25);
      fVar15 = auVar20._0_4_;
      fVar16 = auVar20._4_4_;
      fVar17 = auVar20._8_4_;
      do {
        pTVar3 = this->calculateBounds->mesh;
        lVar12 = (ulong)this->morton[uVar13].field_0.field_0.index * *(long *)&pTVar3->field_0x68;
        lVar4 = *(long *)&(pTVar3->super_Geometry).field_0x58;
        pcVar5 = (pTVar3->vertices0).super_RawBufferView.ptr_ofs;
        sVar6 = (pTVar3->vertices0).super_RawBufferView.stride;
        auVar20 = minps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar12) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar12) * sVar6));
        auVar27 = minps(auVar20,*(undefined1 (*) [16])
                                 (pcVar5 + *(uint *)(lVar4 + 8 + lVar12) * sVar6));
        auVar20 = maxps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar12) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar12) * sVar6));
        auVar20 = maxps(auVar20,*(undefined1 (*) [16])
                                 (pcVar5 + *(uint *)(lVar4 + 8 + lVar12) * sVar6));
        uVar19 = (uint)(((auVar20._0_4_ + auVar27._0_4_) - auVar14._0_4_) *
                       (float)((uint)(((1.0 - auVar25._0_4_ * fVar15) * fVar15 + fVar15) * 1013.76)
                              & -(uint)(1e-19 < auVar25._0_4_)));
        uVar21 = (uint)(((auVar20._4_4_ + auVar27._4_4_) - auVar14._4_4_) *
                       (float)((uint)(((1.0 - auVar25._4_4_ * fVar16) * fVar16 + fVar16) * 1013.76)
                              & -(uint)(1e-19 < auVar25._4_4_)));
        uVar22 = (uint)(((auVar20._8_4_ + auVar27._8_4_) - auVar14._8_4_) *
                       (float)((uint)(((1.0 - auVar25._8_4_ * fVar17) * fVar17 + fVar17) * 1013.76)
                              & -(uint)(1e-19 < auVar25._8_4_)));
        uVar19 = (uVar19 << 0x10 | uVar19) & 0x30000ff;
        uVar19 = (uVar19 << 8 | uVar19) & 0x300f00f;
        uVar21 = (uVar21 << 0x10 | uVar21) & 0x30000ff;
        uVar11 = (uVar21 << 8 | uVar21) & 0x300f00f;
        uVar21 = (uVar22 << 0x10 | uVar22) & 0x30000ff;
        uVar21 = (uVar21 << 8 | uVar21) & 0x300f00f;
        this->morton[uVar13].field_0.field_0.code =
             ((uVar21 << 4 | uVar21) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar11 << 4 | uVar11) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar19 << 4 | uVar19) & 0x30c30c3) * 5 & 0x9249249;
        uVar13 = uVar13 + 1;
        uVar9 = (ulong)current->_end;
      } while (uVar13 < uVar9);
      uVar13 = (ulong)current->_begin;
    }
    if ((int)uVar13 != (int)uVar9) {
      pBVar1 = this->morton + uVar9;
      pBVar2 = this->morton + uVar13;
      uVar9 = (long)(uVar9 * 8 + uVar13 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1);
      return;
    }
  }
  else {
    local_58._0_8_ = 0x7f8000007f800000;
    local_58._8_8_ = 0x7f8000007f800000;
    local_48 = 0xff800000ff800000;
    uStack_40 = 0xff800000ff800000;
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_150.this = this;
    tbb::detail::r1::initialize(&local_d8);
    local_148._4_4_ = uVar19;
    local_148._0_4_ = uVar21;
    local_140 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)0x400;
    local_118.my_real_body = &local_128;
    local_128.reduction = BBox<embree::Vec3fa>::merge;
    local_128.func = &local_150;
    local_118.my_reduction = BBox<embree::Vec3fa>::merge;
    local_118.my_value.lower.field_0._0_8_ = (BBox<embree::Vec3fa> *)0x7f8000007f800000;
    local_118.my_value.lower.field_0._8_8_ =
         (anon_class_16_2_ed117de8_conflict24 *)0x7f8000007f800000;
    local_118.my_value.upper.field_0._0_8_ = 0xff800000ff800000;
    local_118.my_value.upper.field_0._8_8_ = 0xff800000ff800000;
    local_118.my_identity_element = (BBox<embree::Vec3fa> *)&local_58;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_148,&local_118,&local_169,&local_d8);
    local_138 = (BBox<embree::Vec3fa> *)local_118.my_value.lower.field_0._0_8_;
    uStack_130 = (anon_class_16_2_ed117de8_conflict24 *)local_118.my_value.lower.field_0._8_8_;
    local_168._begin = (uint)local_118.my_value.upper.field_0.m128[0];
    local_168._end = (uint)local_118.my_value.upper.field_0.m128[1];
    uStack_160 = local_118.my_value.upper.field_0._8_8_;
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar7 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    auVar20._8_8_ = extraout_XMM1_Qb;
    auVar20._0_8_ = extraout_XMM1_Qa;
    local_118.my_identity_element = local_138;
    local_118.my_real_body = uStack_130;
    fVar23 = (float)local_168._begin - (float)local_138;
    fVar24 = (float)local_168._end - local_138._4_4_;
    uStack_160._0_4_ = (float)uStack_160 - (float)uStack_130;
    uStack_160._4_4_ = uStack_160._4_4_ - uStack_130._4_4_;
    auVar14._4_4_ = fVar24;
    auVar14._0_4_ = fVar23;
    auVar14._8_4_ = (float)uStack_160;
    auVar14._12_4_ = uStack_160._4_4_;
    auVar14 = rcpps(auVar20,auVar14);
    fVar15 = auVar14._0_4_;
    fVar16 = auVar14._4_4_;
    fVar17 = auVar14._8_4_;
    fVar18 = auVar14._12_4_;
    local_118._24_4_ =
         (uint)(((1.0 - (float)uStack_160 * fVar17) * fVar17 + fVar17) * 1013.76) &
         -(uint)(1e-19 < (float)uStack_160);
    local_118._28_4_ =
         (uint)(((1.0 - uStack_160._4_4_ * fVar18) * fVar18 + fVar18) * 1013.76) &
         -(uint)(1e-19 < uStack_160._4_4_);
    local_118.my_reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
         CONCAT44((uint)(((1.0 - fVar24 * fVar16) * fVar16 + fVar16) * 1013.76) &
                  -(uint)(1e-19 < fVar24),
                  (uint)(((1.0 - fVar23 * fVar15) * fVar15 + fVar15) * 1013.76) &
                  -(uint)(1e-19 < fVar23));
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_168 = *current;
    uStack_160 = 0;
    local_148 = this;
    local_140 = &local_118;
    tbb::detail::r1::initialize(&local_d8);
    local_58._0_8_ = CONCAT44(local_168._begin,local_168._end);
    local_58._8_8_ = 0x400;
    local_128.reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)&local_148;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_58.field_1,(anon_class_8_1_898bcfc2 *)&local_128,
          &local_169,&local_d8);
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar7 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    tbb::detail::d1::
    parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,std::less<embree::sse2::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::sse2::BVHBuilderMorton::BuildPrim> *)&local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }